

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O1

void __thiscall rlottie::internal::renderer::Clipper::update(Clipper *this,VMatrix *matrix)

{
  VPath *this_00;
  VPathData *pVVar1;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  void *__buf_00;
  int __fd;
  VRectF *rect;
  VRectF local_30;
  VMatrix *pVVar2;
  
  this_00 = &this->mPath;
  pVVar2 = matrix;
  pVVar1 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,(int)matrix,in_RDX,in_RCX);
  __fd = (int)pVVar2;
  VPath::VPathData::reset(pVVar1);
  rect = &local_30;
  local_30.x1 = 0.0;
  local_30.y1 = 0.0;
  local_30.x2 = (float)(this->mSize).mw;
  local_30.y2 = (float)(this->mSize).mh;
  pVVar1 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,__fd,__buf,in_RCX);
  VPath::VPathData::addRect(pVVar1,rect,CW);
  pVVar1 = (VPathData *)vcow_ptr<VPath::VPathData>::write(&this_00->d,(int)rect,__buf_00,in_RCX);
  VPath::VPathData::transform(pVVar1,matrix);
  this->mRasterRequest = true;
  return;
}

Assistant:

void renderer::Clipper::update(const VMatrix &matrix)
{
    mPath.reset();
    mPath.addRect(VRectF(0, 0, mSize.width(), mSize.height()));
    mPath.transform(matrix);
    mRasterRequest = true;
}